

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuasispeciesEdgeCalculator.cpp
# Opt level: O0

double __thiscall
QuasispeciesEdgeCalculator::computeOverlap
          (QuasispeciesEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,double cutoff)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint *puVar6;
  AlignmentRecord *in_RDX;
  AlignmentRecord *in_RSI;
  QuasispeciesEdgeCalculator *in_RDI;
  bool bVar7;
  double dVar8;
  float overlap_size2_2;
  int read_size2_2;
  float overlap_size1_3;
  int read_size1_3;
  float overlap_size2_1;
  float overlap_size1_2;
  int read_size2_1;
  int read_size1_2;
  float overlap_size2;
  float overlap_size1_1;
  int read_size2;
  int read_size1_1;
  float overlap_size1;
  int read_size1;
  double MIN_OVERLAP;
  double in_stack_00000270;
  double in_stack_00000278;
  int in_stack_00000280;
  int in_stack_00000284;
  AlignmentRecord *in_stack_00000288;
  AlignmentRecord *in_stack_00000290;
  QuasispeciesEdgeCalculator *in_stack_00000298;
  AlignmentRecord *in_stack_fffffffffffffe58;
  float local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  float local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  float local_d0;
  float local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  float local_b0;
  float local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  float local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  byte local_7d;
  string local_70 [32];
  string local_50 [32];
  double local_30;
  AlignmentRecord *local_20;
  AlignmentRecord *local_18;
  double local_8;
  
  local_30 = 0.0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  AlignmentRecord::getName_abi_cxx11_(in_stack_fffffffffffffe58);
  lVar5 = std::__cxx11::string::find((char *)local_50,0x3047ff);
  local_7d = 0;
  bVar7 = false;
  if (lVar5 != -1) {
    AlignmentRecord::getName_abi_cxx11_(in_stack_fffffffffffffe58);
    local_7d = 1;
    lVar5 = std::__cxx11::string::find((char *)local_70,0x3047ff);
    bVar7 = lVar5 != -1;
  }
  if ((local_7d & 1) != 0) {
    std::__cxx11::string::~string(local_70);
  }
  std::__cxx11::string::~string(local_50);
  if (bVar7) {
    local_30 = in_RDI->MIN_OVERLAP_CLIQUES;
  }
  else {
    local_30 = in_RDI->MIN_OVERLAP_SINGLE;
  }
  bVar7 = AlignmentRecord::isSingleEnd(local_18);
  if ((bVar7) && (bVar7 = AlignmentRecord::isSingleEnd(local_20), bVar7)) {
    uVar1 = AlignmentRecord::getEnd1(local_18);
    local_88 = AlignmentRecord::getStart1(local_18);
    local_88 = uVar1 - local_88;
    uVar1 = AlignmentRecord::getEnd1(local_20);
    local_8c = AlignmentRecord::getStart1(local_20);
    local_8c = uVar1 - local_8c;
    puVar6 = std::min<unsigned_int>(&local_88,&local_8c);
    local_84 = *puVar6;
    uVar1 = AlignmentRecord::getEnd1(local_18);
    uVar2 = AlignmentRecord::getEnd1(local_20);
    uVar3 = AlignmentRecord::getStart1(local_18);
    uVar4 = AlignmentRecord::getStart1(local_20);
    local_90 = overlapSize(in_RDI,uVar1,uVar2,uVar3,uVar4);
    if (local_30 <= 1.0) {
      local_90 = local_90 / (float)(int)local_84;
    }
    if (local_30 <= (double)local_90) {
      local_8 = singleOverlap(in_stack_00000298,in_stack_00000290,in_stack_00000288,
                              in_stack_00000284,in_stack_00000280,in_stack_00000278,
                              in_stack_00000270);
    }
    else {
      local_8 = 0.0;
    }
  }
  else {
    bVar7 = AlignmentRecord::isSingleEnd(local_18);
    if ((bVar7) || (bVar7 = AlignmentRecord::isSingleEnd(local_20), bVar7)) {
      bVar7 = AlignmentRecord::isSingleEnd(local_18);
      if (bVar7) {
        uVar1 = AlignmentRecord::getEnd1(local_18);
        local_98 = AlignmentRecord::getStart1(local_18);
        local_98 = uVar1 - local_98;
        uVar1 = AlignmentRecord::getEnd1(local_20);
        local_9c = AlignmentRecord::getStart1(local_20);
        local_9c = uVar1 - local_9c;
        puVar6 = std::min<unsigned_int>(&local_98,&local_9c);
        local_94 = *puVar6;
        uVar1 = AlignmentRecord::getEnd1(local_18);
        local_a4 = AlignmentRecord::getStart1(local_18);
        local_a4 = uVar1 - local_a4;
        uVar1 = AlignmentRecord::getEnd2(local_20);
        local_a8 = AlignmentRecord::getStart2(local_20);
        local_a8 = uVar1 - local_a8;
        puVar6 = std::min<unsigned_int>(&local_a4,&local_a8);
        local_a0 = *puVar6;
        uVar1 = AlignmentRecord::getEnd1(local_18);
        uVar2 = AlignmentRecord::getEnd1(local_20);
        uVar3 = AlignmentRecord::getStart1(local_18);
        uVar4 = AlignmentRecord::getStart1(local_20);
        local_ac = overlapSize(in_RDI,uVar1,uVar2,uVar3,uVar4);
        uVar1 = AlignmentRecord::getEnd1(local_18);
        uVar2 = AlignmentRecord::getEnd2(local_20);
        uVar3 = AlignmentRecord::getStart1(local_18);
        uVar4 = AlignmentRecord::getStart2(local_20);
        local_b0 = overlapSize(in_RDI,uVar1,uVar2,uVar3,uVar4);
        if (local_30 <= 1.0) {
          local_ac = local_ac / (float)(int)local_94;
          local_b0 = local_b0 / (float)(int)local_a0;
        }
        if (((local_30 <= (double)local_ac) && (local_30 <= (double)local_b0)) ||
           ((local_30 <= (double)(local_ac + local_b0) && ((0.0 < local_ac && (0.0 < local_b0))))))
        {
          dVar8 = singleOverlap(in_stack_00000298,in_stack_00000290,in_stack_00000288,
                                in_stack_00000284,in_stack_00000280,in_stack_00000278,
                                in_stack_00000270);
          local_8 = singleOverlap(in_stack_00000298,in_stack_00000290,in_stack_00000288,
                                  in_stack_00000284,in_stack_00000280,in_stack_00000278,
                                  in_stack_00000270);
          local_8 = dVar8 * local_8;
        }
        else {
          local_8 = 0.0;
        }
      }
      else {
        uVar1 = AlignmentRecord::getEnd1(local_18);
        local_b8 = AlignmentRecord::getStart1(local_18);
        local_b8 = uVar1 - local_b8;
        uVar1 = AlignmentRecord::getEnd1(local_20);
        local_bc = AlignmentRecord::getStart1(local_20);
        local_bc = uVar1 - local_bc;
        puVar6 = std::min<unsigned_int>(&local_b8,&local_bc);
        local_b4 = *puVar6;
        uVar1 = AlignmentRecord::getEnd2(local_18);
        local_c4 = AlignmentRecord::getStart2(local_18);
        local_c4 = uVar1 - local_c4;
        uVar1 = AlignmentRecord::getEnd1(local_20);
        local_c8 = AlignmentRecord::getStart1(local_20);
        local_c8 = uVar1 - local_c8;
        puVar6 = std::min<unsigned_int>(&local_c4,&local_c8);
        local_c0 = *puVar6;
        uVar1 = AlignmentRecord::getEnd1(local_18);
        uVar2 = AlignmentRecord::getEnd1(local_20);
        uVar3 = AlignmentRecord::getStart1(local_18);
        uVar4 = AlignmentRecord::getStart1(local_20);
        local_cc = overlapSize(in_RDI,uVar1,uVar2,uVar3,uVar4);
        uVar1 = AlignmentRecord::getEnd2(local_18);
        uVar2 = AlignmentRecord::getEnd1(local_20);
        uVar3 = AlignmentRecord::getStart2(local_18);
        uVar4 = AlignmentRecord::getStart1(local_20);
        local_d0 = overlapSize(in_RDI,uVar1,uVar2,uVar3,uVar4);
        if (local_30 <= 1.0) {
          local_cc = local_cc / (float)(int)local_b4;
          local_d0 = local_d0 / (float)(int)local_c0;
        }
        if (((local_30 <= (double)local_cc) && (local_30 <= (double)local_d0)) ||
           ((local_30 <= (double)(local_cc + local_d0) && ((0.0 < local_cc && (0.0 < local_d0))))))
        {
          dVar8 = singleOverlap(in_stack_00000298,in_stack_00000290,in_stack_00000288,
                                in_stack_00000284,in_stack_00000280,in_stack_00000278,
                                in_stack_00000270);
          local_8 = singleOverlap(in_stack_00000298,in_stack_00000290,in_stack_00000288,
                                  in_stack_00000284,in_stack_00000280,in_stack_00000278,
                                  in_stack_00000270);
          local_8 = dVar8 * local_8;
        }
        else {
          local_8 = 0.0;
        }
      }
    }
    else {
      uVar1 = AlignmentRecord::getEnd1(local_18);
      local_d8 = AlignmentRecord::getStart1(local_18);
      local_d8 = uVar1 - local_d8;
      uVar1 = AlignmentRecord::getEnd1(local_20);
      local_dc = AlignmentRecord::getStart1(local_20);
      local_dc = uVar1 - local_dc;
      puVar6 = std::min<unsigned_int>(&local_d8,&local_dc);
      local_d4 = *puVar6;
      uVar1 = AlignmentRecord::getEnd1(local_18);
      uVar2 = AlignmentRecord::getEnd1(local_20);
      uVar3 = AlignmentRecord::getStart1(local_18);
      uVar4 = AlignmentRecord::getStart1(local_20);
      local_e0 = overlapSize(in_RDI,uVar1,uVar2,uVar3,uVar4);
      if (local_30 <= 1.0) {
        local_e0 = local_e0 / (float)(int)local_d4;
      }
      if (local_30 <= (double)local_e0) {
        uVar1 = AlignmentRecord::getEnd2(local_18);
        local_e8 = AlignmentRecord::getStart2(local_18);
        local_e8 = uVar1 - local_e8;
        uVar1 = AlignmentRecord::getEnd2(local_20);
        local_ec = AlignmentRecord::getStart2(local_20);
        local_ec = uVar1 - local_ec;
        puVar6 = std::min<unsigned_int>(&local_e8,&local_ec);
        local_e4 = *puVar6;
        uVar1 = AlignmentRecord::getEnd2(local_18);
        uVar2 = AlignmentRecord::getEnd2(local_20);
        uVar3 = AlignmentRecord::getStart2(local_18);
        uVar4 = AlignmentRecord::getStart2(local_20);
        local_f0 = overlapSize(in_RDI,uVar1,uVar2,uVar3,uVar4);
        if (local_30 <= 1.0) {
          local_f0 = local_f0 / (float)(int)local_e4;
        }
        if (local_30 <= (double)local_f0) {
          dVar8 = singleOverlap(in_stack_00000298,in_stack_00000290,in_stack_00000288,
                                in_stack_00000284,in_stack_00000280,in_stack_00000278,
                                in_stack_00000270);
          local_8 = singleOverlap(in_stack_00000298,in_stack_00000290,in_stack_00000288,
                                  in_stack_00000284,in_stack_00000280,in_stack_00000278,
                                  in_stack_00000270);
          local_8 = dVar8 * local_8;
        }
        else {
          local_8 = 0.0;
        }
      }
      else {
        local_8 = 0.0;
      }
    }
  }
  return local_8;
}

Assistant:

double QuasispeciesEdgeCalculator::computeOverlap(const AlignmentRecord & ap1, const AlignmentRecord & ap2, const double cutoff) const {

    double MIN_OVERLAP = 0;
    if (ap1.getName().find("Clique") != string::npos && ap2.getName().find("Clique") != string::npos) {
        MIN_OVERLAP = MIN_OVERLAP_CLIQUES;
    } else {
        MIN_OVERLAP = MIN_OVERLAP_SINGLE;
    }

    if (ap1.isSingleEnd() && ap2.isSingleEnd()) {
        int read_size1 = min(ap1.getEnd1() - ap1.getStart1(), ap2.getEnd1() - ap2.getStart1());
        float overlap_size1 = overlapSize(ap1.getEnd1(), ap2.getEnd1(), ap1.getStart1(), ap2.getStart1());
        if (MIN_OVERLAP <= 1) overlap_size1 /= (float) read_size1;
        if (overlap_size1 < MIN_OVERLAP) return 0;
        return singleOverlap(ap1, ap2, 1, 1, MIN_OVERLAP, cutoff);
    } else if (ap1.isSingleEnd() || ap2.isSingleEnd()) {
        if (ap1.isSingleEnd()) {
            int read_size1 = min(ap1.getEnd1() - ap1.getStart1(), ap2.getEnd1() - ap2.getStart1());
            int read_size2 = min(ap1.getEnd1() - ap1.getStart1(), ap2.getEnd2() - ap2.getStart2());
            float overlap_size1 = overlapSize(ap1.getEnd1(), ap2.getEnd1(), ap1.getStart1(), ap2.getStart1());
            float overlap_size2 = overlapSize(ap1.getEnd1(), ap2.getEnd2(), ap1.getStart1(), ap2.getStart2());
            if (MIN_OVERLAP <= 1) {
                overlap_size1 /= (float) read_size1;
                overlap_size2 /= (float) read_size2;
            }
            if ((overlap_size1 >= MIN_OVERLAP && overlap_size2 >= MIN_OVERLAP) || (overlap_size1+overlap_size2 >= MIN_OVERLAP && overlap_size1 > 0 && overlap_size2 > 0)) {
                return singleOverlap(ap1, ap2, 1, 1, MIN_OVERLAP, cutoff)*singleOverlap(ap1, ap2, 1, 2, MIN_OVERLAP, cutoff);
            }
            return 0;
        } else {
            int read_size1 = min(ap1.getEnd1() - ap1.getStart1(), ap2.getEnd1() - ap2.getStart1());
            int read_size2 = min(ap1.getEnd2() - ap1.getStart2(), ap2.getEnd1() - ap2.getStart1());

            float overlap_size1 = overlapSize(ap1.getEnd1(), ap2.getEnd1(), ap1.getStart1(), ap2.getStart1());
            float overlap_size2 = overlapSize(ap1.getEnd2(), ap2.getEnd1(), ap1.getStart2(), ap2.getStart1());
            if (MIN_OVERLAP <= 1) {
                overlap_size1 /= (float) read_size1;
                overlap_size2 /= (float) read_size2;
            }
            if ((overlap_size1 >= MIN_OVERLAP && overlap_size2 >= MIN_OVERLAP) || (overlap_size1+overlap_size2 >= MIN_OVERLAP && overlap_size1 > 0 && overlap_size2 > 0)) {
                return singleOverlap(ap1, ap2, 1, 1, MIN_OVERLAP, cutoff)*singleOverlap(ap1, ap2, 2, 1, MIN_OVERLAP, cutoff);
            }
            return 0;
        }
    } else {
        int read_size1 = min(ap1.getEnd1() - ap1.getStart1(), ap2.getEnd1() - ap2.getStart1());
        float overlap_size1 = overlapSize(ap1.getEnd1(), ap2.getEnd1(), ap1.getStart1(), ap2.getStart1());
        if (MIN_OVERLAP <= 1) overlap_size1 /= (float) read_size1;
        if (overlap_size1 < MIN_OVERLAP) return 0;

        int read_size2 = min(ap1.getEnd2() - ap1.getStart2(), ap2.getEnd2() - ap2.getStart2());
        float overlap_size2 = overlapSize(ap1.getEnd2(), ap2.getEnd2(), ap1.getStart2(), ap2.getStart2());
        if (MIN_OVERLAP <= 1) overlap_size2 /= (float) read_size2;
        if (overlap_size2 < MIN_OVERLAP) return 0;

        return singleOverlap(ap1, ap2, 1, 1, MIN_OVERLAP, cutoff)*singleOverlap(ap1, ap2, 2, 2, MIN_OVERLAP, cutoff);
    }

    return 0;
}